

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.hpp
# Opt level: O2

string * __thiscall
chaiscript::Type_Info::name_abi_cxx11_(string *__return_storage_ptr__,Type_Info *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if (this->m_type_info == (type_info *)0x0) {
    pcVar2 = "";
    paVar1 = &local_a;
  }
  else {
    pcVar2 = *(char **)(this->m_type_info + 8);
    pcVar2 = pcVar2 + (*pcVar2 == '*');
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const
      {
        if (m_type_info)
        {
          return m_type_info->name();
        } else {
          return "";
        }
      }